

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::tydra::anon_unknown_6::GetPrimProperty<tinyusdz::SkelAnimation>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,SkelAnimation *anim,string *prop_name,Property *out_prop)

{
  bool bVar1;
  pointer ppVar2;
  _Hash_node<std::pair<const_float,_tinyusdz::tydra::InbetweenShapeTarget>,_false> *value;
  _Hash_node<std::pair<const_float,_tinyusdz::tydra::InbetweenShapeTarget>,_false> *value_00;
  _Hash_node<std::pair<const_float,_tinyusdz::tydra::InbetweenShapeTarget>,_false> *value_01;
  _Hash_node<std::pair<const_float,_tinyusdz::tydra::InbetweenShapeTarget>,_false> *value_02;
  _Hash_node<std::pair<const_float,_tinyusdz::tydra::InbetweenShapeTarget>,_false> *value_03;
  _Hash_node<std::pair<const_float,_tinyusdz::tydra::InbetweenShapeTarget>,_false> *value_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  bool local_2d2;
  bool local_2d1;
  _Self local_2d0;
  _Self local_2c8;
  const_iterator it;
  string local_2b8 [32];
  string local_298;
  undefined1 local_278 [40];
  string local_250 [32];
  string local_230;
  undefined1 local_210 [40];
  string local_1e8 [32];
  string local_1c8;
  undefined1 local_1a8 [40];
  string local_180 [32];
  string local_160;
  undefined1 local_140 [40];
  string local_118 [32];
  string local_f8;
  undefined1 local_d8 [40];
  string local_b0 [32];
  string local_90;
  undefined1 local_70 [32];
  undefined1 local_50 [8];
  string err;
  Property *out_prop_local;
  string *prop_name_local;
  SkelAnimation *anim_local;
  
  if (out_prop == (Property *)0x0) {
    err.field_2._8_8_ =
         nonstd::expected_lite::make_unexpected<char_const(&)[59]>
                   ((char (*) [59])"[InternalError] nullptr in output Property is not allowed.");
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>
              (__return_storage_ptr__,(unexpected_type<const_char_*> *)((long)&err.field_2 + 8));
    return __return_storage_ptr__;
  }
  ::std::__cxx11::string::string((string *)local_50);
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            prop_name,"blendShapes");
  if (bVar1) {
    bVar1 = (anonymous_namespace)::
            ToProperty<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                      (&anim->blendShapes,out_prop,(string *)local_50);
    if (!bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_b0,"Convert Property {} failed: {}\n",(allocator *)(local_d8 + 0x27));
      fmt::format<char[12],std::__cxx11::string>
                (&local_90,(fmt *)local_b0,(string *)0x9e04b6,(char (*) [12])local_50,in_R8);
      nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_70,(expected_lite *)&local_90,value);
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (__return_storage_ptr__,
                 (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_70);
      nonstd::expected_lite::
      unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_70);
      ::std::__cxx11::string::~string((string *)&local_90);
      ::std::__cxx11::string::~string(local_b0);
      ::std::allocator<char>::~allocator((allocator<char> *)(local_d8 + 0x27));
      goto LAB_007dab6a;
    }
  }
  else {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              prop_name,"blendShapeWeights");
    if (bVar1) {
      bVar1 = (anonymous_namespace)::ToProperty<std::vector<float,std::allocator<float>>>
                        (&anim->blendShapeWeights,out_prop,(string *)local_50);
      if (!bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_118,"Convert Property {} failed: {}\n",(allocator *)(local_140 + 0x27));
        fmt::format<char[18],std::__cxx11::string>
                  (&local_f8,(fmt *)local_118,(string *)"blendShapeWeights",(char (*) [18])local_50,
                   in_R8);
        nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                  ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_d8,(expected_lite *)&local_f8,value_00);
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (__return_storage_ptr__,
                   (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_d8);
        nonstd::expected_lite::
        unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_d8);
        ::std::__cxx11::string::~string((string *)&local_f8);
        ::std::__cxx11::string::~string(local_118);
        ::std::allocator<char>::~allocator((allocator<char> *)(local_140 + 0x27));
        goto LAB_007dab6a;
      }
    }
    else {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )prop_name,"joints");
      if (bVar1) {
        bVar1 = (anonymous_namespace)::
                ToProperty<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                          (&anim->joints,out_prop,(string *)local_50);
        if (!bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_180,"Convert Property {} failed: {}\n",(allocator *)(local_1a8 + 0x27));
          fmt::format<char[7],std::__cxx11::string>
                    (&local_160,(fmt *)local_180,(string *)0xa00639,(char (*) [7])local_50,in_R8);
          nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                    ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_140,(expected_lite *)&local_160,value_01);
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (__return_storage_ptr__,
                     (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_140);
          nonstd::expected_lite::
          unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_140);
          ::std::__cxx11::string::~string((string *)&local_160);
          ::std::__cxx11::string::~string(local_180);
          ::std::allocator<char>::~allocator((allocator<char> *)(local_1a8 + 0x27));
          goto LAB_007dab6a;
        }
      }
      else {
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)prop_name,"rotations");
        if (bVar1) {
          bVar1 = (anonymous_namespace)::
                  ToProperty<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                            (&anim->rotations,out_prop,(string *)local_50);
          if (!bVar1) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_1e8,"Convert Property {} failed: {}\n",(allocator *)(local_210 + 0x27))
            ;
            fmt::format<char[10],std::__cxx11::string>
                      (&local_1c8,(fmt *)local_1e8,(string *)"rotations",(char (*) [10])local_50,
                       in_R8);
            nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                      ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_1a8,(expected_lite *)&local_1c8,value_02);
            nonstd::expected_lite::
            expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (__return_storage_ptr__,
                       (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_1a8);
            nonstd::expected_lite::
            unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_1a8);
            ::std::__cxx11::string::~string((string *)&local_1c8);
            ::std::__cxx11::string::~string(local_1e8);
            ::std::allocator<char>::~allocator((allocator<char> *)(local_210 + 0x27));
            goto LAB_007dab6a;
          }
        }
        else {
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)prop_name,"scales");
          if (bVar1) {
            bVar1 = (anonymous_namespace)::
                    ToProperty<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                              (&anim->scales,out_prop,(string *)local_50);
            if (!bVar1) {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_250,"Convert Property {} failed: {}\n",
                         (allocator *)(local_278 + 0x27));
              fmt::format<char[7],std::__cxx11::string>
                        (&local_230,(fmt *)local_250,(string *)"scales",(char (*) [7])local_50,in_R8
                        );
              nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                        ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_210,(expected_lite *)&local_230,value_03);
              nonstd::expected_lite::
              expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (__return_storage_ptr__,
                         (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_210);
              nonstd::expected_lite::
              unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_210);
              ::std::__cxx11::string::~string((string *)&local_230);
              ::std::__cxx11::string::~string(local_250);
              ::std::allocator<char>::~allocator((allocator<char> *)(local_278 + 0x27));
              goto LAB_007dab6a;
            }
          }
          else {
            bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)prop_name,"translations");
            if (bVar1) {
              bVar1 = (anonymous_namespace)::
                      ToProperty<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                                (&anim->translations,out_prop,(string *)local_50);
              if (!bVar1) {
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_2b8,"Convert Property {} failed: {}\n",
                           (allocator *)((long)&it._M_node + 7));
                fmt::format<char[13],std::__cxx11::string>
                          (&local_298,(fmt *)local_2b8,(string *)"translations",
                           (char (*) [13])local_50,in_R8);
                nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                          ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_278,(expected_lite *)&local_298,value_04);
                nonstd::expected_lite::
                expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::
                expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (__return_storage_ptr__,
                           (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_278);
                nonstd::expected_lite::
                unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)local_278);
                ::std::__cxx11::string::~string((string *)&local_298);
                ::std::__cxx11::string::~string(local_2b8);
                ::std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
                goto LAB_007dab6a;
              }
            }
            else {
              local_2c8._M_node =
                   (_Base_ptr)
                   ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   ::find(&anim->props,prop_name);
              local_2d0._M_node =
                   (_Base_ptr)
                   ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   ::end(&anim->props);
              bVar1 = ::std::operator==(&local_2c8,&local_2d0);
              if (bVar1) {
                local_2d1 = false;
                nonstd::expected_lite::
                expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::expected<bool,_0>(__return_storage_ptr__,&local_2d1);
                goto LAB_007dab6a;
              }
              ppVar2 = ::std::
                       _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
                       ::operator->(&local_2c8);
              Property::operator=(out_prop,&ppVar2->second);
            }
          }
        }
      }
    }
  }
  local_2d2 = true;
  nonstd::expected_lite::
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  expected<bool,_0>(__return_storage_ptr__,&local_2d2);
LAB_007dab6a:
  local_d8._32_4_ = 1;
  ::std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<bool, std::string> GetPrimProperty(
    const SkelAnimation &anim, const std::string &prop_name,
    Property *out_prop) {
  if (!out_prop) {
    return nonstd::make_unexpected(
        "[InternalError] nullptr in output Property is not allowed.");
  }

  DCOUT("prop_name = " << prop_name);
  std::string err;

  TO_PROPERTY("blendShapes", anim.blendShapes)
  TO_PROPERTY("blendShapeWeights", anim.blendShapeWeights)
  TO_PROPERTY("joints", anim.joints)
  TO_PROPERTY("rotations", anim.rotations)
  TO_PROPERTY("scales", anim.scales)
  TO_PROPERTY("translations", anim.translations)

  {
    const auto it = anim.props.find(prop_name);
    if (it == anim.props.end()) {
      // Attribute not found.
      return false;
    }

    (*out_prop) = it->second;
  }
  DCOUT("Prop found: " << prop_name
                       << ", ty = " << out_prop->value_type_name());
  return true;
}